

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O3

bool duckdb::LikeOperatorFunction(string_t *s,string_t *pat)

{
  bool bVar1;
  ulong plen;
  char *pdata;
  ulong slen;
  char *sdata;
  
  slen = (ulong)(s->value).pointer.length;
  if (slen < 0xd) {
    sdata = (s->value).pointer.prefix;
  }
  else {
    sdata = (s->value).pointer.ptr;
  }
  plen = (ulong)(pat->value).pointer.length;
  if (plen < 0xd) {
    pdata = (pat->value).pointer.prefix;
  }
  else {
    pdata = (pat->value).pointer.ptr;
  }
  bVar1 = TemplatedLikeOperator<(char)37,(char)95,false,duckdb::StandardCharacterReader>
                    (sdata,slen,pdata,plen,'\0');
  return bVar1;
}

Assistant:

bool LikeOperatorFunction(string_t &s, string_t &pat) {
	return LikeOperatorFunction(s.GetData(), s.GetSize(), pat.GetData(), pat.GetSize());
}